

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCases.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::Texture2DRenderCase::~Texture2DRenderCase(Texture2DRenderCase *this)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_20;
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_18;
  iterator i;
  Texture2DRenderCase *this_local;
  
  (this->super_ShaderPerformanceCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DRenderCase_03296560;
  i._M_current = (Texture2D **)this;
  local_18._M_current =
       (Texture2D **)
       std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::begin(&this->m_textures);
  while( true ) {
    local_20._M_current =
         (Texture2D **)
         std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::end(&this->m_textures);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
              ::operator*(&local_18);
    if (*ppTVar2 != (Texture2D *)0x0) {
      (*(*ppTVar2)->_vptr_Texture2D[1])();
    }
    __gnu_cxx::
    __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
    ::operator++(&local_18,0);
  }
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::clear(&this->m_textures);
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::~vector(&this->m_textures);
  tcu::Matrix<float,_3,_3>::~Matrix(&this->m_coordTransform);
  deqp::gls::ShaderPerformanceCase::~ShaderPerformanceCase(&this->super_ShaderPerformanceCase);
  return;
}

Assistant:

Texture2DRenderCase::~Texture2DRenderCase (void)
{
	for (vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
		delete *i;
	m_textures.clear();
}